

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void pugi::impl::(anonymous_namespace)::node_copy_string<char*,unsigned_long>
               (char **dest,unsigned_long *header,uintptr_t header_mask,char_t *source,
               unsigned_long *source_header,xml_allocator *alloc)

{
  size_t source_length;
  
  if (source != (char_t *)0x0) {
    if ((alloc == (xml_allocator *)0x0) || ((*source_header & header_mask) != 0)) {
      source_length = strlen(source);
      strcpy_insitu<char*,unsigned_long>(dest,header,header_mask,source,source_length);
      return;
    }
    *dest = source;
    *(byte *)header = (byte)*header | 0x40;
    *(byte *)source_header = (byte)*source_header | 0x40;
  }
  return;
}

Assistant:

PUGI_IMPL_FN void node_copy_string(String& dest, Header& header, uintptr_t header_mask, char_t* source, Header& source_header, xml_allocator* alloc)
	{
		assert(!dest && (header & header_mask) == 0); // copies are performed into fresh nodes

		if (source)
		{
			if (alloc && (source_header & header_mask) == 0)
			{
				dest = source;

				// since strcpy_insitu can reuse document buffer memory we need to mark both source and dest as shared
				header |= xml_memory_page_contents_shared_mask;
				source_header |= xml_memory_page_contents_shared_mask;
			}
			else
				strcpy_insitu(dest, header, header_mask, source, strlength(source));
		}
	}